

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O3

Vector3f __thiscall
pbrt::TrowbridgeReitzDistribution::Sample_wm
          (TrowbridgeReitzDistribution *this,Vector3f wo,Point2f u)

{
  ulong uVar1;
  Vector3f VVar2;
  Tuple3<pbrt::Vector3,_float> TVar3;
  
  if (0.0 <= wo.super_Tuple3<pbrt::Vector3,_float>.z) {
    TVar3 = (Tuple3<pbrt::Vector3,_float>)
            SampleTrowbridgeReitzVisibleArea(wo,this->alpha_x,this->alpha_y,u);
  }
  else {
    VVar2.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
         wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    VVar2.super_Tuple3<pbrt::Vector3,_float>.z = -wo.super_Tuple3<pbrt::Vector3,_float>.z;
    VVar2 = SampleTrowbridgeReitzVisibleArea(VVar2,this->alpha_x,this->alpha_y,u);
    uVar1 = VVar2.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
    TVar3.z = -VVar2.super_Tuple3<pbrt::Vector3,_float>.z;
    TVar3.x = (float)(int)uVar1;
    TVar3.y = (float)(int)(uVar1 >> 0x20);
  }
  return (Vector3f)TVar3;
}

Assistant:

PBRT_CPU_GPU
    Vector3f Sample_wm(Vector3f wo, Point2f u) const {
        bool flip = wo.z < 0;
        Vector3f wm =
            SampleTrowbridgeReitzVisibleArea(flip ? -wo : wo, alpha_x, alpha_y, u);
        return flip ? -wm : wm;
    }